

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

Type * __thiscall
spvtools::opt::analysis::ConstantManager::GetType(ConstantManager *this,Instruction *inst)

{
  uint32_t id;
  IRContext *this_00;
  TypeManager *this_01;
  Type *pTVar1;
  Instruction *inst_local;
  ConstantManager *this_local;
  
  this_00 = context(this);
  this_01 = IRContext::get_type_mgr(this_00);
  id = opt::Instruction::type_id(inst);
  pTVar1 = TypeManager::GetType(this_01,id);
  return pTVar1;
}

Assistant:

Type* ConstantManager::GetType(const Instruction* inst) const {
  return context()->get_type_mgr()->GetType(inst->type_id());
}